

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzP.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzP::ArchiveIN(ChNodeFEAxyzP *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::fea::ChNodeFEAxyzP>(marchive);
  ChNodeBase::ArchiveIN
            ((ChNodeBase *)
             ((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
             (long)(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3]),marchive);
  local_30 = &this->P;
  local_38 = "P";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->P_dt;
  local_38 = "P_dt";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->F;
  local_38 = "F";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChNodeFEAxyzP::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeFEAxyzP>();
    // deserialize parent class
    ChNodeFEAbase::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(P);
    marchive >> CHNVP(P_dt);
    marchive >> CHNVP(F);
}